

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

VarType * __thiscall deqp::ub::VarType::operator=(VarType *this,VarType *other)

{
  VarType *pVVar1;
  VarType *local_30;
  undefined8 local_28;
  VarType *local_20;
  VarType *other_local;
  VarType *this_local;
  
  if (this != other) {
    local_20 = other;
    other_local = this;
    if ((this->m_type == TYPE_ARRAY) &&
       (pVVar1 = (this->m_data).array.elementType, pVVar1 != (VarType *)0x0)) {
      ~VarType(pVVar1);
      operator_delete(pVVar1,0x18);
    }
    this->m_type = local_20->m_type;
    this->m_flags = local_20->m_flags;
    Data::Data((Data *)&local_30);
    (this->m_data).array.elementType = local_30;
    *(undefined8 *)((long)&this->m_data + 8) = local_28;
    if (this->m_type == TYPE_ARRAY) {
      pVVar1 = (VarType *)operator_new(0x18);
      VarType(pVVar1,(local_20->m_data).array.elementType);
      (this->m_data).array.elementType = pVVar1;
      (this->m_data).array.size = (local_20->m_data).array.size;
    }
    else {
      (this->m_data).array.elementType = (local_20->m_data).array.elementType;
      *(undefined8 *)((long)&this->m_data + 8) = *(undefined8 *)((long)&local_20->m_data + 8);
    }
  }
  return this;
}

Assistant:

VarType& VarType::operator=(const VarType& other)
{
	if (this == &other)
		return *this; // Self-assignment.

	if (m_type == TYPE_ARRAY)
		delete m_data.array.elementType;

	m_type  = other.m_type;
	m_flags = other.m_flags;
	m_data  = Data();

	if (m_type == TYPE_ARRAY)
	{
		m_data.array.elementType = new VarType(*other.m_data.array.elementType);
		m_data.array.size		 = other.m_data.array.size;
	}
	else
		m_data = other.m_data;

	return *this;
}